

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFParsingUtils.h
# Opt level: O1

bool iDynTree::stringToDoubleWithClassicLocale(string *inStr,double *outDouble)

{
  byte bVar1;
  istringstream ss;
  locale alStack_198 [8];
  double local_190 [4];
  byte abStack_170 [88];
  ios_base local_118 [264];
  
  std::__cxx11::istringstream::istringstream((istringstream *)local_190,(string *)inStr,_S_in);
  std::locale::classic();
  std::ios::imbue(alStack_198);
  std::locale::~locale(alStack_198);
  std::istream::_M_extract<double>(local_190);
  bVar1 = abStack_170[*(long *)((long)local_190[0] + -0x18)];
  std::__cxx11::istringstream::~istringstream((istringstream *)local_190);
  std::ios_base::~ios_base(local_118);
  return (bVar1 & 5) == 0;
}

Assistant:

bool inline stringToDoubleWithClassicLocale(const std::string & inStr, double & outDouble)
{
    std::istringstream ss(inStr);
    ss.imbue(std::locale::classic());
    ss >> outDouble;
    return !(ss.fail());
}